

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord,ImGuiInputFlags flags,ImGuiID owner_id)

{
  code *pcVar1;
  ImGuiContext *pIVar2;
  undefined1 uVar3;
  uint key_chord_00;
  uint uVar4;
  ImGuiID IVar5;
  long lVar6;
  char *pcVar7;
  ImGuiKeyRoutingData *pIVar8;
  uint uVar9;
  ImGuiID *pIVar10;
  long lVar11;
  uint uVar12;
  char *fmt;
  bool bVar13;
  ulong uVar14;
  
  pIVar2 = GImGui;
  uVar12 = flags | 0xd000;
  if ((flags & 0x3c00U) != 0) {
    uVar12 = flags;
  }
  key_chord_00 = FixupKeyChord(key_chord);
  if (pIVar2->DebugBreakInShortcutRouting == key_chord_00) {
    pcVar1 = (code *)swi(3);
    uVar3 = (*pcVar1)();
    return (bool)uVar3;
  }
  if (((uVar12 >> 0x10 & 1) != 0) && (pIVar2->NavWindow == (ImGuiWindow *)0x0)) {
    return false;
  }
  if ((uVar12 >> 0xd & 1) == 0) {
    if (pIVar2->ActiveId != owner_id && pIVar2->ActiveId != 0) {
      if ((uVar12 >> 10 & 1) != 0) {
        return false;
      }
      if (((((pIVar2->IO).WantTextInput == true) && ((key_chord_00 & 0x5000) != 0x1000)) &&
          (((key_chord_00 >> 0xc & 1) == 0 || ((GImGui->IO).ConfigMacOSXBehaviors == false)))) &&
         (((GImGui->KeysMayBeCharInput).Storage[(int)((key_chord_00 & 0xffff0fe0) - 0x200) >> 5] >>
           (key_chord_00 & 0x1f) & 1) != 0)) {
        if ((pIVar2->DebugLogFlags & 0x80) == 0) {
          return false;
        }
        pcVar7 = GetKeyChordName(key_chord_00);
        fmt = 
        "SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> filtered as potential char input\n";
        bVar13 = false;
        goto LAB_0018b6a8;
      }
      if (((-1 < (short)uVar12) && (pIVar2->ActiveIdUsingAllKeyboardKeys == true)) &&
         (((uVar4 = key_chord_00 & 0xffff0fff, (key_chord_00 & 0xffff0fff) != 0 ||
           ((uVar9 = key_chord_00 - 0x1000 >> 0xc, uVar4 = key_chord_00, 7 < uVar9 ||
            ((0x8bU >> (uVar9 & 0x1f) & 1) == 0)))) && (0xffffff88 < uVar4 - 0x277)))) {
        return false;
      }
    }
    if ((uVar12 >> 0x11 & 1) == 0) {
      pIVar10 = &pIVar2->CurrentFocusScopeId;
    }
    else {
      pIVar10 = &pIVar2->CurrentWindow->RootWindow->ID;
    }
    if ((uVar12 >> 0xb & 1) == 0) {
      if ((uVar12 >> 10 & 1) == 0) {
        uVar14 = 0;
        if (((uVar12 & 0x9000) == 0x1000) && (uVar14 = 2, (uVar12 >> 0xe & 1) == 0)) {
          uVar14 = 0xfe;
        }
      }
      else if ((owner_id == 0) || (uVar14 = 1, GImGui->ActiveId != owner_id)) {
        uVar14 = 0xff;
      }
    }
    else if ((((owner_id == 0) || (uVar14 = 1, GImGui->ActiveId != owner_id)) &&
             (uVar14 = 0xff, *pIVar10 != 0)) &&
            (lVar11 = (long)(GImGui->NavFocusRoute).Size, 0 < lVar11)) {
      lVar6 = 0;
      do {
        if ((GImGui->NavFocusRoute).Data[lVar6].ID == *pIVar10) {
          uVar14 = (ulong)((int)lVar6 + 3);
          break;
        }
        lVar6 = lVar6 + 1;
      } while (lVar11 != lVar6);
    }
    if ((pIVar2->DebugLogFlags & 0x80) != 0) {
      pcVar7 = GetKeyChordName(key_chord_00);
      DebugLog("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> score %d\n",pcVar7,
               (ulong)uVar12,(ulong)owner_id,uVar14);
    }
    if ((int)uVar14 == 0xff) {
      return false;
    }
    pIVar8 = GetShortcutRoutingData(key_chord_00);
    if ((int)uVar14 < (int)(uint)pIVar8->RoutingNextScore) {
      pIVar8->RoutingNext = owner_id;
      pIVar8->RoutingNextScore = (ImU8)uVar14;
    }
    IVar5 = pIVar8->RoutingCurr;
    if ((pIVar8->RoutingCurr == owner_id) && (IVar5 = owner_id, (pIVar2->DebugLogFlags & 0x80) != 0)
       ) {
      DebugLog("--> granting current route\n");
      IVar5 = pIVar8->RoutingCurr;
    }
    return IVar5 == owner_id;
  }
  bVar13 = true;
  if ((pIVar2->DebugLogFlags & 0x80) == 0) {
    return true;
  }
  pcVar7 = GetKeyChordName(key_chord_00);
  fmt = "SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> always, no register\n";
LAB_0018b6a8:
  DebugLog(fmt,pcVar7,(ulong)uVar12,(ulong)owner_id);
  return bVar13;
}

Assistant:

bool ImGui::SetShortcutRouting(ImGuiKeyChord key_chord, ImGuiInputFlags flags, ImGuiID owner_id)
{
    ImGuiContext& g = *GImGui;
    if ((flags & ImGuiInputFlags_RouteTypeMask_) == 0)
        flags |= ImGuiInputFlags_RouteGlobal | ImGuiInputFlags_RouteOverFocused | ImGuiInputFlags_RouteOverActive; // IMPORTANT: This is the default for SetShortcutRouting() but NOT Shortcut()
    else
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiInputFlags_RouteTypeMask_)); // Check that only 1 routing flag is used
    IM_ASSERT(owner_id != ImGuiKeyOwner_Any && owner_id != ImGuiKeyOwner_NoOwner);
    if (flags & (ImGuiInputFlags_RouteOverFocused | ImGuiInputFlags_RouteOverActive | ImGuiInputFlags_RouteUnlessBgFocused))
        IM_ASSERT(flags & ImGuiInputFlags_RouteGlobal);

    // Add ImGuiMod_XXXX when a corresponding ImGuiKey_LeftXXX/ImGuiKey_RightXXX is specified.
    key_chord = FixupKeyChord(key_chord);

    // [DEBUG] Debug break requested by user
    if (g.DebugBreakInShortcutRouting == key_chord)
        IM_DEBUG_BREAK();

    if (flags & ImGuiInputFlags_RouteUnlessBgFocused)
        if (g.NavWindow == NULL)
            return false;

    // Note how ImGuiInputFlags_RouteAlways won't set routing and thus won't set owner. May want to rework this?
    if (flags & ImGuiInputFlags_RouteAlways)
    {
        IMGUI_DEBUG_LOG_INPUTROUTING("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> always, no register\n", GetKeyChordName(key_chord), flags, owner_id);
        return true;
    }

    // Specific culling when there's an active item.
    if (g.ActiveId != 0 && g.ActiveId != owner_id)
    {
        if (flags & ImGuiInputFlags_RouteActive)
            return false;

        // Cull shortcuts with no modifiers when it could generate a character.
        // e.g. Shortcut(ImGuiKey_G) also generates 'g' character, should not trigger when InputText() is active.
        // but  Shortcut(Ctrl+G) should generally trigger when InputText() is active.
        // TL;DR: lettered shortcut with no mods or with only Alt mod will not trigger while an item reading text input is active.
        // (We cannot filter based on io.InputQueueCharacters[] contents because of trickling and key<>chars submission order are undefined)
        if (g.IO.WantTextInput && IsKeyChordPotentiallyCharInput(key_chord))
        {
            IMGUI_DEBUG_LOG_INPUTROUTING("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> filtered as potential char input\n", GetKeyChordName(key_chord), flags, owner_id);
            return false;
        }

        // ActiveIdUsingAllKeyboardKeys trumps all for ActiveId
        if ((flags & ImGuiInputFlags_RouteOverActive) == 0 && g.ActiveIdUsingAllKeyboardKeys)
        {
            ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
            if (key == ImGuiKey_None)
                key = ConvertSingleModFlagToKey((ImGuiKey)(key_chord & ImGuiMod_Mask_));
            if (key >= ImGuiKey_Keyboard_BEGIN && key < ImGuiKey_Keyboard_END)
                return false;
        }
    }

    // Where do we evaluate route for?
    ImGuiID focus_scope_id = g.CurrentFocusScopeId;
    if (flags & ImGuiInputFlags_RouteFromRootWindow)
        focus_scope_id = g.CurrentWindow->RootWindow->ID; // See PushFocusScope() call in Begin()

    const int score = CalcRoutingScore(focus_scope_id, owner_id, flags);
    IMGUI_DEBUG_LOG_INPUTROUTING("SetShortcutRouting(%s, flags=%04X, owner_id=0x%08X) -> score %d\n", GetKeyChordName(key_chord), flags, owner_id, score);
    if (score == 255)
        return false;

    // Submit routing for NEXT frame (assuming score is sufficient)
    // FIXME: Could expose a way to use a "serve last" policy for same score resolution (using <= instead of <).
    ImGuiKeyRoutingData* routing_data = GetShortcutRoutingData(key_chord);
    //const bool set_route = (flags & ImGuiInputFlags_ServeLast) ? (score <= routing_data->RoutingNextScore) : (score < routing_data->RoutingNextScore);
    if (score < routing_data->RoutingNextScore)
    {
        routing_data->RoutingNext = owner_id;
        routing_data->RoutingNextScore = (ImU8)score;
    }

    // Return routing state for CURRENT frame
    if (routing_data->RoutingCurr == owner_id)
        IMGUI_DEBUG_LOG_INPUTROUTING("--> granting current route\n");
    return routing_data->RoutingCurr == owner_id;
}